

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1decode.c
# Opt level: O0

FT_Error t1_decoder_parse_metrics
                   (T1_Decoder_conflict decoder,FT_Byte *charstring_base,FT_UInt charstring_len)

{
  bool bVar1;
  uint uVar2;
  FT_Long FVar3;
  size_t *psVar4;
  T1_Decoder_Zone pTVar5;
  T1_Builder pTVar6;
  int local_84;
  size_t *val;
  FT_Int idx;
  FT_Int num_args;
  FT_Int32 value;
  T1_Operator op;
  FT_Long *top;
  FT_Bool large_int;
  T1_Builder builder;
  FT_Byte *limit;
  FT_Byte *ip;
  T1_Decoder_Zone zone;
  FT_UInt charstring_len_local;
  FT_Byte *charstring_base_local;
  T1_Decoder_conflict decoder_local;
  
  decoder->top = decoder->stack;
  decoder->zone = decoder->zones;
  ip = (FT_Byte *)decoder->zones;
  (decoder->builder).parse_state = T1_Parse_Start;
  decoder->zones[0].base = charstring_base;
  builder = (T1_Builder)(charstring_base + charstring_len);
  decoder->zones[0].limit = (FT_Byte *)builder;
  limit = decoder->zones[0].base;
  ((T1_Decoder_ZoneRec *)ip)->cursor = limit;
  bVar1 = false;
  do {
    while( true ) {
      if (builder <= limit) {
        return 0xa0;
      }
      _value = decoder->top;
      num_args = 0;
      idx = 0;
      pTVar6 = (T1_Builder)(limit + 1);
      uVar2 = (uint)*limit;
      if (uVar2 == 1) {
        return 0xa0;
      }
      if (uVar2 - 3 < 7) {
        return 0xa0;
      }
      if (uVar2 == 10) {
        num_args = 0x16;
        limit = (FT_Byte *)pTVar6;
      }
      else if (uVar2 == 0xb) {
        num_args = 0x18;
        limit = (FT_Byte *)pTVar6;
      }
      else if (uVar2 == 0xc) {
        if (builder <= pTVar6) {
          return 0xa0;
        }
        limit = limit + 2;
        if (*(char *)&pTVar6->memory == '\a') {
          num_args = 4;
        }
        else {
          if (*(char *)&pTVar6->memory != '\f') {
            return 0xa0;
          }
          num_args = 0x14;
        }
      }
      else if (uVar2 == 0xd) {
        num_args = 2;
        limit = (FT_Byte *)pTVar6;
      }
      else {
        if (uVar2 - 0xe < 2) {
          return 0xa0;
        }
        if (uVar2 - 0x15 < 2) {
          return 0xa0;
        }
        if (uVar2 - 0x1e < 2) {
          return 0xa0;
        }
        if (uVar2 == 0xff) {
          if (builder < (T1_Builder)(limit + 5)) {
            return 0xa0;
          }
          idx = (uint)*(byte *)&pTVar6->memory << 0x18 | (uint)limit[2] << 0x10 |
                (uint)limit[3] << 8 | (uint)limit[4];
          limit = limit + 5;
          if ((idx < 0x7d01) && (-0x7d01 < idx)) {
            if (!bVar1) {
              idx = idx << 0x10;
            }
          }
          else {
            if (bVar1) {
              return 0xa0;
            }
            bVar1 = true;
          }
        }
        else {
          if (*limit < 0x20) {
            return 0xa0;
          }
          if (*limit < 0xf7) {
            idx = *limit - 0x8b;
            limit = (FT_Byte *)pTVar6;
          }
          else {
            pTVar6 = (T1_Builder)(limit + 2);
            if (builder < pTVar6) {
              return 0xa0;
            }
            if (*limit < 0xfb) {
              idx = (*limit - 0xf7) * 0x100 + (uint)limit[1] + 0x6c;
              limit = (FT_Byte *)pTVar6;
            }
            else {
              idx = -((*limit - 0xfb) * 0x100 + (uint)limit[1] + 0x6c);
              limit = (FT_Byte *)pTVar6;
            }
          }
          if (!bVar1) {
            idx = idx << 0x10;
          }
        }
      }
      if (((bVar1) && (num_args != 0)) && (num_args != 0x14)) {
        return 0xa0;
      }
      if (num_args != 0) break;
      if (0xff < (long)_value - (long)decoder->stack >> 3) {
        return 0xa0;
      }
      *_value = (long)idx;
      decoder->top = _value + 1;
    }
    if ((long)_value - (long)decoder->stack >> 3 < (long)t1_args_count[(uint)num_args]) {
      return 0xa1;
    }
    _value = _value + -(long)t1_args_count[(uint)num_args];
    switch(num_args) {
    case 2:
      (decoder->builder).parse_state = T1_Parse_Have_Width;
      (decoder->builder).left_bearing.x = (decoder->builder).left_bearing.x + *_value;
      (decoder->builder).advance.x = _value[1];
      (decoder->builder).advance.y = 0;
      return 0;
    case 4:
      (decoder->builder).parse_state = T1_Parse_Have_Width;
      (decoder->builder).left_bearing.x = (decoder->builder).left_bearing.x + *_value;
      (decoder->builder).left_bearing.y = (decoder->builder).left_bearing.y + _value[1];
      (decoder->builder).advance.x = _value[2];
      (decoder->builder).advance.y = _value[3];
      return 0;
    default:
      return 0xa0;
    case 0x14:
      FVar3 = FT_DivFix(*_value,_value[1]);
      *_value = FVar3;
      _value = _value + 1;
      bVar1 = false;
      break;
    case 0x16:
      val._0_4_ = (int)(short)((ulong)*_value >> 0x10);
      if (decoder->subrs_hash != (FT_Hash)0x0) {
        psVar4 = ft_hash_num_lookup((int)val,decoder->subrs_hash);
        if (psVar4 == (size_t *)0x0) {
          val._0_4_ = -1;
        }
        else {
          val._0_4_ = (int)*psVar4;
        }
      }
      if ((int)val < 0) {
        return 0xa0;
      }
      if (decoder->num_subrs <= (int)val) {
        return 0xa0;
      }
      if (0xf < ((long)ip - (long)decoder->zones) / 0x18) {
        return 0xa0;
      }
      *(FT_Byte **)ip = limit;
      pTVar5 = (T1_Decoder_Zone)(ip + 0x18);
      *(FT_Byte **)(ip + 0x20) = decoder->subrs[(int)val];
      if (decoder->subrs_len == (FT_UInt *)0x0) {
        if (decoder->lenIV < 0) {
          local_84 = 0;
        }
        else {
          local_84 = decoder->lenIV;
        }
        *(long *)(ip + 0x20) = *(long *)(ip + 0x20) + (long)local_84;
        *(FT_Byte **)(ip + 0x28) = decoder->subrs[(int)val + 1];
      }
      else {
        *(ulong *)(ip + 0x28) = *(long *)(ip + 0x20) + (ulong)decoder->subrs_len[(int)val];
      }
      pTVar5->cursor = *(FT_Byte **)(ip + 0x20);
      if (*(long *)(ip + 0x20) == 0) {
        return 0xa0;
      }
      decoder->zone = pTVar5;
      limit = *(FT_Byte **)(ip + 0x20);
      builder = *(T1_Builder *)(ip + 0x28);
      ip = (FT_Byte *)pTVar5;
      break;
    case 0x18:
      if (ip <= decoder->zones) {
        return 0xa0;
      }
      pTVar5 = (T1_Decoder_Zone)(ip + -0x18);
      limit = pTVar5->cursor;
      builder = *(T1_Builder *)(ip + -8);
      decoder->zone = pTVar5;
      ip = (FT_Byte *)pTVar5;
    }
    decoder->top = _value;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t1_decoder_parse_metrics( T1_Decoder  decoder,
                            FT_Byte*    charstring_base,
                            FT_UInt     charstring_len )
  {
    T1_Decoder_Zone  zone;
    FT_Byte*         ip;
    FT_Byte*         limit;
    T1_Builder       builder = &decoder->builder;
    FT_Bool          large_int;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_Bool          bol = TRUE;
#endif


    /* First of all, initialize the decoder */
    decoder->top  = decoder->stack;
    decoder->zone = decoder->zones;
    zone          = decoder->zones;

    builder->parse_state = T1_Parse_Start;

    zone->base           = charstring_base;
    limit = zone->limit  = charstring_base + charstring_len;
    ip    = zone->cursor = zone->base;

    large_int = FALSE;

    /* now, execute loop */
    while ( ip < limit )
    {
      FT_Long*     top   = decoder->top;
      T1_Operator  op    = op_none;
      FT_Int32     value = 0;


#ifdef FT_DEBUG_LEVEL_TRACE
      if ( bol )
      {
        FT_TRACE5(( " (%ld)", decoder->top - decoder->stack ));
        bol = FALSE;
      }
#endif

      /**********************************************************************
       *
       * Decode operator or operand
       *
       */

      /* first of all, decompress operator or value */
      switch ( *ip++ )
      {
      case 1:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
      case 14:
      case 15:
      case 21:
      case 22:
      case 30:
      case 31:
        goto No_Width;

      case 10:
        op = op_callsubr;
        break;
      case 11:
        op = op_return;
        break;

      case 13:
        op = op_hsbw;
        break;

      case 12:
        if ( ip >= limit )
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " invalid escape (12+EOF)\n" ));
          goto Syntax_Error;
        }

        switch ( *ip++ )
        {
        case 7:
          op = op_sbw;
          break;
        case 12:
          op = op_div;
          break;

        default:
          goto No_Width;
        }
        break;

      case 255:    /* four bytes integer */
        if ( ip + 4 > limit )
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " unexpected EOF in integer\n" ));
          goto Syntax_Error;
        }

        value = (FT_Int32)( ( (FT_UInt32)ip[0] << 24 ) |
                            ( (FT_UInt32)ip[1] << 16 ) |
                            ( (FT_UInt32)ip[2] << 8  ) |
                              (FT_UInt32)ip[3]         );
        ip += 4;

        /* According to the specification, values > 32000 or < -32000 must */
        /* be followed by a `div' operator to make the result be in the    */
        /* range [-32000;32000].  We expect that the second argument of    */
        /* `div' is not a large number.  Additionally, we don't handle     */
        /* stuff like `<large1> <large2> <num> div <num> div' or           */
        /* <large1> <large2> <num> div div'.  This is probably not allowed */
        /* anyway.                                                         */
        if ( value > 32000 || value < -32000 )
        {
          if ( large_int )
          {
            FT_ERROR(( "t1_decoder_parse_metrics:"
                       " no `div' after large integer\n" ));
            goto Syntax_Error;
          }
          else
            large_int = TRUE;
        }
        else
        {
          if ( !large_int )
            value = (FT_Int32)( (FT_UInt32)value << 16 );
        }

        break;

      default:
        if ( ip[-1] >= 32 )
        {
          if ( ip[-1] < 247 )
            value = (FT_Int32)ip[-1] - 139;
          else
          {
            if ( ++ip > limit )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " unexpected EOF in integer\n" ));
              goto Syntax_Error;
            }

            if ( ip[-2] < 251 )
              value =    ( ( ip[-2] - 247 ) * 256 ) + ip[-1] + 108;
            else
              value = -( ( ( ip[-2] - 251 ) * 256 ) + ip[-1] + 108 );
          }

          if ( !large_int )
            value = (FT_Int32)( (FT_UInt32)value << 16 );
        }
        else
        {
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " invalid byte (%d)\n", ip[-1] ));
          goto Syntax_Error;
        }
      }

      if ( large_int && !( op == op_none || op == op_div ) )
      {
        FT_ERROR(( "t1_decoder_parse_metrics:"
                   " no `div' after large integer\n" ));
        goto Syntax_Error;
      }

      /**********************************************************************
       *
       * Push value on stack, or process operator
       *
       */
      if ( op == op_none )
      {
        if ( top - decoder->stack >= T1_MAX_CHARSTRINGS_OPERANDS )
        {
          FT_ERROR(( "t1_decoder_parse_metrics: stack overflow\n" ));
          goto Syntax_Error;
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( large_int )
          FT_TRACE4(( " %d", value ));
        else
          FT_TRACE4(( " %d", value / 65536 ));
#endif

        *top++       = value;
        decoder->top = top;
      }
      else  /* general operator */
      {
        FT_Int  num_args = t1_args_count[op];


        FT_ASSERT( num_args >= 0 );

        if ( top - decoder->stack < num_args )
          goto Stack_Underflow;

#ifdef FT_DEBUG_LEVEL_TRACE

        switch ( op )
        {
        case op_callsubr:
        case op_div:
        case op_return:
          break;

        default:
          if ( top - decoder->stack != num_args )
            FT_TRACE0(( "t1_decoder_parse_metrics:"
                        " too much operands on the stack"
                        " (seen %ld, expected %d)\n",
                        top - decoder->stack, num_args ));
          break;
        }

#endif /* FT_DEBUG_LEVEL_TRACE */

        top -= num_args;

        switch ( op )
        {
        case op_hsbw:
          FT_TRACE4(( " hsbw" ));

          builder->parse_state = T1_Parse_Have_Width;

          builder->left_bearing.x = ADD_LONG( builder->left_bearing.x,
                                              top[0] );

          builder->advance.x = top[1];
          builder->advance.y = 0;

          /* we only want to compute the glyph's metrics */
          /* (lsb + advance width) without loading the   */
          /* rest of it; so exit immediately             */
          FT_TRACE4(( "\n" ));
          return FT_Err_Ok;

        case op_sbw:
          FT_TRACE4(( " sbw" ));

          builder->parse_state = T1_Parse_Have_Width;

          builder->left_bearing.x = ADD_LONG( builder->left_bearing.x,
                                              top[0] );
          builder->left_bearing.y = ADD_LONG( builder->left_bearing.y,
                                              top[1] );

          builder->advance.x = top[2];
          builder->advance.y = top[3];

          /* we only want to compute the glyph's metrics */
          /* (lsb + advance width), without loading the  */
          /* rest of it; so exit immediately             */
          FT_TRACE4(( "\n" ));
          return FT_Err_Ok;

        case op_div:
          FT_TRACE4(( " div" ));

          /* if `large_int' is set, we divide unscaled numbers; */
          /* otherwise, we divide numbers in 16.16 format --    */
          /* in both cases, it is the same operation            */
          *top = FT_DivFix( top[0], top[1] );
          top++;

          large_int = FALSE;
          break;

        case op_callsubr:
          {
            FT_Int  idx;


            FT_TRACE4(( " callsubr" ));

            idx = Fix2Int( top[0] );

            if ( decoder->subrs_hash )
            {
              size_t*  val = ft_hash_num_lookup( idx,
                                                 decoder->subrs_hash );


              if ( val )
                idx = *val;
              else
                idx = -1;
            }

            if ( idx < 0 || idx >= decoder->num_subrs )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " invalid subrs index\n" ));
              goto Syntax_Error;
            }

            if ( zone - decoder->zones >= T1_MAX_SUBRS_CALLS )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " too many nested subrs\n" ));
              goto Syntax_Error;
            }

            zone->cursor = ip;  /* save current instruction pointer */

            zone++;

            /* The Type 1 driver stores subroutines without the seed bytes. */
            /* The CID driver stores subroutines with seed bytes.  This     */
            /* case is taken care of when decoder->subrs_len == 0.          */
            zone->base = decoder->subrs[idx];

            if ( decoder->subrs_len )
              zone->limit = zone->base + decoder->subrs_len[idx];
            else
            {
              /* We are using subroutines from a CID font.  We must adjust */
              /* for the seed bytes.                                       */
              zone->base  += ( decoder->lenIV >= 0 ? decoder->lenIV : 0 );
              zone->limit  = decoder->subrs[idx + 1];
            }

            zone->cursor = zone->base;

            if ( !zone->base )
            {
              FT_ERROR(( "t1_decoder_parse_metrics:"
                         " invoking empty subrs\n" ));
              goto Syntax_Error;
            }

            decoder->zone = zone;
            ip            = zone->base;
            limit         = zone->limit;
            break;
          }

        case op_return:
          FT_TRACE4(( " return" ));

          if ( zone <= decoder->zones )
          {
            FT_ERROR(( "t1_decoder_parse_metrics:"
                       " unexpected return\n" ));
            goto Syntax_Error;
          }

          zone--;
          ip            = zone->cursor;
          limit         = zone->limit;
          decoder->zone = zone;
          break;

        default:
          FT_ERROR(( "t1_decoder_parse_metrics:"
                     " unhandled opcode %d\n", op ));
          goto Syntax_Error;
        }

        decoder->top = top;

      } /* general operator processing */

    } /* while ip < limit */

    FT_TRACE4(( "..end..\n" ));
    FT_TRACE4(( "\n" ));

  No_Width:
    FT_ERROR(( "t1_decoder_parse_metrics:"
               " no width, found op %d instead\n",
               ip[-1] ));
  Syntax_Error:
    return FT_THROW( Syntax_Error );

  Stack_Underflow:
    return FT_THROW( Stack_Underflow );
  }